

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_call_to_arms(CHAR_DATA *ch,char *arguement)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var5;
  CHAR_DATA *target_next;
  CHAR_DATA *target;
  int in_stack_000000a4;
  bool in_stack_000000ab;
  int in_stack_000000ac;
  CHAR_DATA *in_stack_000000b0;
  int in_stack_000000cc;
  CHAR_DATA *in_stack_000000d0;
  int in_stack_000001f4;
  CHAR_DATA *in_stack_000001f8;
  CHAR_DATA *in_stack_00000200;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  CHAR_DATA *ch_00;
  CHAR_DATA *in_stack_ffffffffffffffe0;
  CHAR_DATA *local_18;
  
  bVar2 = is_npc(in_stack_ffffffffffffffc8);
  if (!bVar2) {
    if (in_RDI->mana < 10) {
      send_to_char((char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
    else if (in_RDI->fighting == (CHAR_DATA *)0x0) {
      send_to_char((char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      act((char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
          (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
          in_stack_ffffffffffffffc8,0);
    }
    else {
      ch_00 = (CHAR_DATA *)in_RDI->act[0];
      _Var5 = std::pow<int,int>(0,0x5ef857);
      if (((ulong)ch_00 & (long)_Var5) == 0) {
        bVar2 = is_good(in_stack_ffffffffffffffc8);
        if (bVar2) {
          iVar3 = number_percent();
          iVar4 = get_skill(in_stack_000000d0,in_stack_000000cc);
          if (iVar4 < iVar3) {
            send_to_char((char *)in_stack_ffffffffffffffe0,ch_00);
            iVar3 = (int)((ulong)ch_00 >> 0x20);
            check_improve(in_stack_000000b0,in_stack_000000ac,in_stack_000000ab,in_stack_000000a4);
            WAIT_STATE(in_stack_ffffffffffffffe0,iVar3);
          }
          else {
            act((char *)in_stack_ffffffffffffffe0,ch_00,
                (void *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,0);
            send_to_char((char *)in_stack_ffffffffffffffe0,ch_00);
            pCVar1 = in_RDI->in_room->people;
            while (local_18 = pCVar1, local_18 != (CHAR_DATA *)0x0) {
              in_stack_ffffffffffffffe0 = local_18->next_in_room;
              bVar2 = is_good(in_stack_ffffffffffffffc8);
              pCVar1 = in_stack_ffffffffffffffe0;
              if (((((bVar2) &&
                    (bVar2 = is_npc(in_stack_ffffffffffffffc8), pCVar1 = in_stack_ffffffffffffffe0,
                    bVar2)) &&
                   (bVar2 = is_affected_by(ch_00,iVar3), pCVar1 = in_stack_ffffffffffffffe0, !bVar2)
                   ) && ((bVar2 = is_same_group(in_RDI,local_18), pCVar1 = in_stack_ffffffffffffffe0
                         , !bVar2 && (pCVar1 = in_stack_ffffffffffffffe0, 4 < local_18->position))))
                 && ((pCVar1 = in_stack_ffffffffffffffe0, local_18->position != 7 &&
                     ((pCVar1 = in_stack_ffffffffffffffe0, 0xe < in_RDI->mana &&
                      (pCVar1 = in_stack_ffffffffffffffe0, in_RDI->fighting != (CHAR_DATA *)0x0)))))
                 ) {
                if (in_RDI->level + 0xc < (int)local_18->level) {
                  act((char *)in_stack_ffffffffffffffe0,ch_00,
                      (void *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,0)
                  ;
                  pCVar1 = in_stack_ffffffffffffffe0;
                }
                else {
                  iVar4 = number_percent();
                  if (((int)in_RDI->level - (int)local_18->level) + 0x46 < iVar4) {
                    act((char *)in_stack_ffffffffffffffe0,ch_00,
                        (void *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
                        0);
                    check_improve(in_stack_000000b0,in_stack_000000ac,in_stack_000000ab,
                                  in_stack_000000a4);
                    pCVar1 = in_stack_ffffffffffffffe0;
                  }
                  else {
                    in_RDI->mana = in_RDI->mana + -0xf;
                    act((char *)in_stack_ffffffffffffffe0,ch_00,
                        (void *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
                        0);
                    act((char *)in_stack_ffffffffffffffe0,ch_00,
                        (void *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
                        0);
                    act((char *)in_stack_ffffffffffffffe0,ch_00,
                        (void *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
                        0);
                    multi_hit(in_stack_00000200,in_stack_000001f8,in_stack_000001f4);
                    pCVar1 = in_stack_ffffffffffffffe0;
                  }
                }
              }
            }
            WAIT_STATE(in_stack_ffffffffffffffe0,(int)((ulong)ch_00 >> 0x20));
          }
        }
        else {
          send_to_char((char *)in_stack_ffffffffffffffe0,ch_00);
          act((char *)in_stack_ffffffffffffffe0,ch_00,
              (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffc8,0);
        }
      }
      else {
        send_to_char((char *)in_stack_ffffffffffffffe0,ch_00);
      }
    }
  }
  return;
}

Assistant:

void do_call_to_arms(CHAR_DATA *ch, char *arguement)
{
	CHAR_DATA *target;
	CHAR_DATA *target_next;

	if (is_npc(ch))
		return;

	if (ch->mana < 10)
	{
		send_to_char("You are unable to muster the force of will to lead more crusades.\n\r", ch);
		return;
	}

	if (ch->fighting == nullptr)
	{
		send_to_char("You give a stirring call to arms, but alas there is nobody to fight.\n\r", ch);
		act("$n cries out to nobody in particular to fight nobody in particular.", ch, nullptr, nullptr, TO_ROOM);
		return;
	}

	if (IS_SET(ch->act, PLR_CRIMINAL))
	{
		send_to_char("Do you really think people will rally to a criminal?!\n\r", ch);
		return;
	}

	if (!is_good(ch))
	{
		send_to_char("Despite your best attempts nobody will join you.\n\r", ch);
		act("$n gives a pathetic call to arms.", ch, nullptr, nullptr, TO_ROOM);
		return;
	}

	if (number_percent() > get_skill(ch, gsn_rally))
	{
		send_to_char("You yell some wild rhetoric but fail to inspire anyone.\n\r", ch);
		check_improve(ch, gsn_rally, false, 2);
		WAIT_STATE(ch, 12);
		return;
	}

	act("$n gives a stirring call to arms!", ch, nullptr, nullptr, TO_ROOM);
	send_to_char("You give a stirring call to arms!\n\r", ch);

	for (target = ch->in_room->people; target != nullptr; target = target_next)
	{
		target_next = target->next_in_room;

		if (!is_good(target) || !is_npc(target) || is_affected_by(target, AFF_CHARM))
			continue;

		if (is_same_group(ch, target) || target->position < POS_RESTING)
			continue;

		if (target->position == POS_FIGHTING)
			continue;

		if (ch->mana < 15)
			continue;

		if (ch->fighting == nullptr)
			continue;

		if (target->level > (ch->level + 12))
		{
			act("$n tells you, 'Fight your own battles and prove your worth paladin'", target, nullptr, ch, TO_VICT);
			continue;
		}

		if (number_percent() > (ch->level - target->level + 70))
		{
			act("Your call to arms gets little more than a passing consideration from $N.", ch, nullptr, target, TO_CHAR);
			check_improve(ch, gsn_rally, false, 2);
			continue;
		}

		ch->mana -= 15;

		act("$N rallies to your call!", ch, nullptr, target, TO_CHAR);
		act("$n screams and rushes to attack $N!", target, nullptr, ch->fighting, TO_NOTVICT);
		act("$n screams and rushes forwards to attack you!", target, nullptr, ch->fighting, TO_VICT);
		multi_hit(target, ch->fighting, TYPE_UNDEFINED);
		continue;
	}

	WAIT_STATE(ch, 12);
}